

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BeliefSetNonStationary *Beliefs,QFunctionsDiscreteNonStationary *Q)

{
  pointer pdVar1;
  size_t __n;
  const_reference Beliefs_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  vector<double,_std::allocator<double>_> valuesT;
  
  __n = BeliefSetNonStationary::Size(Beliefs);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&valuesT);
  iVar2 = 0;
  uVar5 = 0;
  while( true ) {
    uVar4 = (ulong)uVar5;
    if (((long)(Q->
               super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(Q->
              super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 == uVar4) break;
    Beliefs_00 = std::
                 vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                 ::at(&Beliefs->_m_beliefSets,uVar4);
    GetValues(&valuesT,Beliefs_00,
              (Q->
              super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar4);
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    while (iVar3 = (int)uVar4,
          (long)valuesT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)valuesT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != uVar4) {
      pdVar1[(uint)(iVar3 + iVar2)] =
           valuesT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4];
      uVar4 = (ulong)(iVar3 + 1);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&valuesT);
    uVar5 = uVar5 + 1;
    iVar2 = iVar2 + iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSetNonStationary &Beliefs,
                                      const QFunctionsDiscreteNonStationary &Q)
{
    vector<double> values(Beliefs.Size());
    Index i=0;
    for(Index t=0;t!=Q.size();++t)
    {
        vector<double> valuesT=GetValues(Beliefs.Get(t),
                                         Q[t]);
        for(Index k=0;k!=valuesT.size();++k)
        {
            values[i]=valuesT[k];
            i++;
        }
    }
    return(values);
}